

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestQueue.cpp
# Opt level: O2

void anon_unknown.dwarf_16501c::readq(QueueReader *r,size_t size)

{
  Result *in_R9;
  ExpressionDecomposer local_84;
  size_t size_local;
  Result local_78;
  Expression_lhs<unsigned_long> local_58;
  ReadResult rr;
  
  size_local = size;
  binlog::detail::QueueReader::beginRead(&rr,r);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_84,DT_CHECK);
  local_58.lhs = rr.size2 + rr.size1;
  local_58.m_at = local_84.m_at;
  doctest::detail::Expression_lhs<unsigned_long>::operator>=(&local_78,&local_58,&size_local);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x191760,(char *)0x1b,0x191940,&local_78.m_passed,in_R9);
  doctest::String::~String(&local_78.m_decomp);
  (r->_queue->readIndex).super___atomic_base<unsigned_long>._M_i = r->_readEnd;
  return;
}

Assistant:

void readq(binlog::detail::QueueReader& r, std::size_t size)
{
  const auto rr = r.beginRead();
  CHECK(rr.size1 + rr.size2 >= size);
  r.endRead();
}